

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Import::~Import(Import *this)

{
  Import *this_local;
  
  this->_vptr_Import = (_func_int **)&PTR__Import_00307308;
  std::__cxx11::string::~string((string *)&this->field_name);
  std::__cxx11::string::~string((string *)&this->module_name);
  return;
}

Assistant:

virtual ~Import() = default;